

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  int iVar13;
  undefined4 uVar14;
  size_t sVar15;
  undefined8 uVar16;
  float **ppfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  Geometry *pGVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar35;
  uint uVar36;
  int iVar37;
  undefined4 uVar38;
  long lVar39;
  RTCRayN *pRVar40;
  long lVar41;
  undefined4 uVar42;
  Scene *pSVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar47;
  uint *puVar48;
  ulong uVar49;
  size_t sVar50;
  float fVar51;
  float fVar82;
  float fVar83;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar84;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar81;
  float fVar85;
  float fVar100;
  float fVar102;
  float fVar103;
  undefined1 auVar87 [16];
  uint uVar86;
  uint uVar101;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar104;
  float fVar111;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar127;
  float fVar130;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar118;
  float fVar132;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar128;
  float fVar129;
  float fVar131;
  float fVar133;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar140;
  float fVar147;
  float fVar148;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar144;
  float fVar149;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar150;
  float fVar156;
  float fVar157;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar158;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar159;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar179;
  float fVar184;
  float fVar185;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar186;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar187 [16];
  float fVar191;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c0;
  float fStack_13bc;
  vbool<4> valid;
  undefined8 local_1378;
  undefined8 uStack_1370;
  BVH *local_1368;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  float fStack_1310;
  float fStack_130c;
  vfloat<4> tNear;
  undefined1 local_1288 [16];
  undefined1 local_1278 [16];
  undefined1 local_1268 [16];
  undefined1 local_1258 [16];
  undefined1 local_1248 [16];
  undefined1 local_1238 [16];
  undefined1 local_1228 [16];
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  undefined1 local_11f8 [8];
  float fStack_11f0;
  float fStack_11ec;
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  undefined8 local_11b8;
  float fStack_11b0;
  float fStack_11ac;
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  undefined8 local_1198;
  float fStack_1190;
  float fStack_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  undefined8 local_1168;
  float fStack_1160;
  float fStack_115c;
  undefined8 local_1158;
  ulong local_1150;
  ulong local_1148;
  ulong local_1140;
  ulong local_1138;
  long local_1130;
  undefined1 local_1128 [16];
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined4 local_10e8;
  undefined4 uStack_10e4;
  undefined4 uStack_10e0;
  undefined4 uStack_10dc;
  undefined4 local_10d8;
  undefined4 uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  undefined4 local_10c8;
  undefined4 uStack_10c4;
  undefined4 uStack_10c0;
  undefined4 uStack_10bc;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  uint local_1098;
  uint uStack_1094;
  uint uStack_1090;
  uint uStack_108c;
  uint local_1088;
  uint uStack_1084;
  uint uStack_1080;
  uint uStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined1 local_fd8 [16];
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar47 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_1008 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_1018 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1028 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1038 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1048 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1058 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1078 = local_1038 * 0.99999964;
  local_1118 = local_1048 * 0.99999964;
  local_1068 = local_1058 * 0.99999964;
  local_1038 = local_1038 * 1.0000004;
  local_1048 = local_1048 * 1.0000004;
  local_1058 = local_1058 * 1.0000004;
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1158 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1138 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1140 = uVar44 ^ 0x10;
  local_1148 = local_1158 ^ 0x10;
  local_1150 = local_1138 ^ 0x10;
  iVar37 = (tray->tnear).field_0.i[k];
  local_1128._4_4_ = iVar37;
  local_1128._0_4_ = iVar37;
  local_1128._8_4_ = iVar37;
  local_1128._12_4_ = iVar37;
  iVar37 = (tray->tfar).field_0.i[k];
  auVar61._4_4_ = iVar37;
  auVar61._0_4_ = iVar37;
  auVar61._8_4_ = iVar37;
  auVar61._12_4_ = iVar37;
  local_fe8 = mm_lookupmask_ps._0_8_;
  uStack_fe0 = mm_lookupmask_ps._8_8_;
  local_ff8 = mm_lookupmask_ps._240_8_;
  uStack_ff0 = mm_lookupmask_ps._248_8_;
  lVar41 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  fStack_1054 = local_1058;
  fStack_1050 = local_1058;
  fStack_104c = local_1058;
  fStack_1064 = local_1068;
  fStack_1060 = local_1068;
  fStack_105c = local_1068;
  fStack_1074 = local_1078;
  fStack_1070 = local_1078;
  fStack_106c = local_1078;
  fStack_1114 = local_1118;
  fStack_1110 = local_1118;
  fStack_110c = local_1118;
  uVar46 = local_1158;
  auVar93 = local_1128;
  fVar149 = local_1008;
  fVar103 = local_1008;
  fVar84 = local_1008;
  fVar185 = local_1008;
  fVar134 = local_1018;
  fVar179 = local_1018;
  fVar113 = local_1018;
  fVar114 = local_1018;
  fVar184 = local_1058;
  fVar128 = local_1058;
  fVar129 = local_1058;
  fVar131 = local_1058;
  fVar133 = local_1078;
  fVar51 = local_1078;
  fVar82 = local_1078;
  fVar83 = local_1078;
  fVar85 = local_1118;
  fVar100 = local_1118;
  fVar102 = local_1118;
  fVar104 = local_1118;
  fVar111 = local_1028;
  fVar112 = local_1028;
  fVar127 = local_1028;
  fVar130 = local_1028;
  fVar132 = local_1038;
  fVar140 = local_1038;
  fVar147 = local_1038;
  fVar148 = local_1038;
  fVar150 = local_1048;
  fVar156 = local_1048;
  fVar157 = local_1048;
  fVar158 = local_1048;
  fVar159 = local_1068;
  fVar162 = local_1068;
  fVar163 = local_1068;
  fVar164 = local_1068;
  do {
    do {
      do {
        if (pSVar47 == stack) {
          return;
        }
        pSVar35 = pSVar47 + -1;
        pSVar47 = pSVar47 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar35->dist &&
               (float)pSVar35->dist != *(float *)(ray + k * 4 + 0x80));
      sVar50 = (pSVar47->ptr).ptr;
      do {
        if ((sVar50 & 8) == 0) {
          pfVar12 = (float *)(sVar50 + 0x20 + uVar44);
          auVar52._0_4_ = (*pfVar12 - fVar149) * fVar133;
          auVar52._4_4_ = (pfVar12[1] - fVar103) * fVar51;
          auVar52._8_4_ = (pfVar12[2] - fVar84) * fVar82;
          auVar52._12_4_ = (pfVar12[3] - fVar185) * fVar83;
          pfVar12 = (float *)(sVar50 + 0x20 + uVar46);
          auVar143._0_4_ = (*pfVar12 - fVar134) * fVar85;
          auVar143._4_4_ = (pfVar12[1] - fVar179) * fVar100;
          auVar143._8_4_ = (pfVar12[2] - fVar113) * fVar102;
          auVar143._12_4_ = (pfVar12[3] - fVar114) * fVar104;
          auVar52 = maxps(auVar52,auVar143);
          pfVar12 = (float *)(sVar50 + 0x20 + local_1138);
          auVar152._0_4_ = (*pfVar12 - fVar111) * fVar159;
          auVar152._4_4_ = (pfVar12[1] - fVar112) * fVar162;
          auVar152._8_4_ = (pfVar12[2] - fVar127) * fVar163;
          auVar152._12_4_ = (pfVar12[3] - fVar130) * fVar164;
          auVar105 = maxps(auVar152,auVar93);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar52,auVar105);
          pfVar12 = (float *)(sVar50 + 0x20 + local_1140);
          auVar106._0_4_ = (*pfVar12 - fVar149) * fVar132;
          auVar106._4_4_ = (pfVar12[1] - fVar103) * fVar140;
          auVar106._8_4_ = (pfVar12[2] - fVar84) * fVar147;
          auVar106._12_4_ = (pfVar12[3] - fVar185) * fVar148;
          pfVar12 = (float *)(sVar50 + 0x20 + local_1148);
          auVar115._0_4_ = (*pfVar12 - fVar134) * fVar150;
          auVar115._4_4_ = (pfVar12[1] - fVar179) * fVar156;
          auVar115._8_4_ = (pfVar12[2] - fVar113) * fVar157;
          auVar115._12_4_ = (pfVar12[3] - fVar114) * fVar158;
          auVar52 = minps(auVar106,auVar115);
          pfVar12 = (float *)(sVar50 + 0x20 + local_1150);
          auVar116._0_4_ = (*pfVar12 - fVar111) * fVar184;
          auVar116._4_4_ = (pfVar12[1] - fVar112) * fVar128;
          auVar116._8_4_ = (pfVar12[2] - fVar127) * fVar129;
          auVar116._12_4_ = (pfVar12[3] - fVar130) * fVar131;
          auVar105 = minps(auVar116,auVar61);
          auVar52 = minps(auVar52,auVar105);
          auVar105._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar52._4_4_);
          auVar105._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar52._0_4_);
          auVar105._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar52._8_4_);
          auVar105._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar52._12_4_);
          uVar42 = movmskps((int)bvh,auVar105);
          bvh = (BVH *)CONCAT44((int)((ulong)bvh >> 0x20),uVar42);
        }
        if ((sVar50 & 8) == 0) {
          if (bvh == (BVH *)0x0) {
            iVar37 = 4;
          }
          else {
            uVar49 = sVar50 & 0xfffffffffffffff0;
            lVar23 = 0;
            if (bvh != (BVH *)0x0) {
              for (; ((ulong)bvh >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
              }
            }
            iVar37 = 0;
            sVar50 = *(size_t *)(uVar49 + lVar23 * 8);
            uVar45 = (ulong)&bvh[-1].field_0x23f & (ulong)bvh;
            if (uVar45 != 0) {
              uVar36 = tNear.field_0.i[lVar23];
              lVar23 = 0;
              if (uVar45 != 0) {
                for (; (uVar45 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                }
              }
              sVar15 = *(size_t *)(uVar49 + lVar23 * 8);
              uVar86 = tNear.field_0.i[lVar23];
              uVar45 = uVar45 - 1 & uVar45;
              if (uVar45 == 0) {
                if (uVar36 < uVar86) {
                  (pSVar47->ptr).ptr = sVar15;
                  pSVar47->dist = uVar86;
                  pSVar47 = pSVar47 + 1;
                }
                else {
                  (pSVar47->ptr).ptr = sVar50;
                  pSVar47->dist = uVar36;
                  pSVar47 = pSVar47 + 1;
                  sVar50 = sVar15;
                }
              }
              else {
                auVar107._8_4_ = uVar36;
                auVar107._0_8_ = sVar50;
                auVar107._12_4_ = 0;
                auVar141._8_4_ = uVar86;
                auVar141._0_8_ = sVar15;
                auVar141._12_4_ = 0;
                lVar23 = 0;
                if (uVar45 != 0) {
                  for (; (uVar45 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                  }
                }
                uVar16 = *(undefined8 *)(uVar49 + lVar23 * 8);
                iVar13 = tNear.field_0.i[lVar23];
                auVar117._8_4_ = iVar13;
                auVar117._0_8_ = uVar16;
                auVar117._12_4_ = 0;
                auVar53._8_4_ = -(uint)((int)uVar36 < (int)uVar86);
                uVar45 = uVar45 - 1 & uVar45;
                if (uVar45 == 0) {
                  auVar53._4_4_ = auVar53._8_4_;
                  auVar53._0_4_ = auVar53._8_4_;
                  auVar53._12_4_ = auVar53._8_4_;
                  auVar135._8_4_ = uVar86;
                  auVar135._0_8_ = sVar15;
                  auVar135._12_4_ = 0;
                  auVar105 = blendvps(auVar135,auVar107,auVar53);
                  auVar52 = blendvps(auVar107,auVar141,auVar53);
                  auVar54._8_4_ = -(uint)(auVar105._8_4_ < iVar13);
                  auVar54._4_4_ = auVar54._8_4_;
                  auVar54._0_4_ = auVar54._8_4_;
                  auVar54._12_4_ = auVar54._8_4_;
                  auVar142._8_4_ = iVar13;
                  auVar142._0_8_ = uVar16;
                  auVar142._12_4_ = 0;
                  auVar143 = blendvps(auVar142,auVar105,auVar54);
                  auVar105 = blendvps(auVar105,auVar117,auVar54);
                  auVar55._8_4_ = -(uint)(auVar52._8_4_ < auVar105._8_4_);
                  auVar55._4_4_ = auVar55._8_4_;
                  auVar55._0_4_ = auVar55._8_4_;
                  auVar55._12_4_ = auVar55._8_4_;
                  SVar118 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar105,auVar52,auVar55);
                  SVar108 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar52,auVar105,auVar55);
                  *pSVar47 = SVar108;
                  pSVar47[1] = SVar118;
                  sVar50 = auVar143._0_8_;
                  pSVar47 = pSVar47 + 2;
                }
                else {
                  lVar23 = 0;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                    }
                  }
                  auVar93._4_4_ = auVar53._8_4_;
                  auVar93._0_4_ = auVar53._8_4_;
                  auVar93._8_4_ = auVar53._8_4_;
                  auVar93._12_4_ = auVar53._8_4_;
                  auVar105 = blendvps(auVar141,auVar107,auVar93);
                  auVar93 = blendvps(auVar107,auVar141,auVar93);
                  auVar151._8_4_ = tNear.field_0.i[lVar23];
                  auVar151._0_8_ = *(undefined8 *)(uVar49 + lVar23 * 8);
                  auVar151._12_4_ = 0;
                  auVar56._8_4_ = -(uint)(iVar13 < tNear.field_0.i[lVar23]);
                  auVar56._4_4_ = auVar56._8_4_;
                  auVar56._0_4_ = auVar56._8_4_;
                  auVar56._12_4_ = auVar56._8_4_;
                  auVar143 = blendvps(auVar151,auVar117,auVar56);
                  auVar52 = blendvps(auVar117,auVar151,auVar56);
                  auVar57._8_4_ = -(uint)(auVar93._8_4_ < auVar52._8_4_);
                  auVar57._4_4_ = auVar57._8_4_;
                  auVar57._0_4_ = auVar57._8_4_;
                  auVar57._12_4_ = auVar57._8_4_;
                  auVar152 = blendvps(auVar52,auVar93,auVar57);
                  SVar108 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar93,auVar52,auVar57);
                  auVar58._8_4_ = -(uint)(auVar105._8_4_ < auVar143._8_4_);
                  auVar58._4_4_ = auVar58._8_4_;
                  auVar58._0_4_ = auVar58._8_4_;
                  auVar58._12_4_ = auVar58._8_4_;
                  auVar93 = blendvps(auVar143,auVar105,auVar58);
                  auVar52 = blendvps(auVar105,auVar143,auVar58);
                  auVar59._8_4_ = -(uint)(auVar52._8_4_ < auVar152._8_4_);
                  auVar59._4_4_ = auVar59._8_4_;
                  auVar59._0_4_ = auVar59._8_4_;
                  auVar59._12_4_ = auVar59._8_4_;
                  SVar144 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar152,auVar52,auVar59);
                  SVar118 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar52,auVar152,auVar59);
                  *pSVar47 = SVar108;
                  pSVar47[1] = SVar118;
                  pSVar47[2] = SVar144;
                  sVar50 = auVar93._0_8_;
                  pSVar47 = pSVar47 + 3;
                  auVar93 = local_1128;
                  fVar85 = local_1118;
                  fVar100 = fStack_1114;
                  fVar102 = fStack_1110;
                  fVar104 = fStack_110c;
                }
              }
            }
          }
        }
        else {
          iVar37 = 6;
        }
      } while (iVar37 == 0);
    } while (iVar37 != 6);
    uVar46 = (ulong)((uint)sVar50 & 0xf);
    if (uVar46 != 8) {
      local_1130 = 0;
      local_1368 = bvh;
      do {
        lVar39 = local_1130 * 0x60;
        pSVar43 = context->scene;
        puVar1 = (uint *)((sVar50 & 0xfffffffffffffff0) + lVar39);
        puVar48 = puVar1 + 0x10;
        ppfVar17 = (pSVar43->vertices).items;
        pfVar18 = ppfVar17[*puVar48];
        pfVar12 = pfVar18 + *puVar1;
        pfVar2 = pfVar18 + puVar1[4];
        pfVar3 = pfVar18 + puVar1[8];
        fVar179 = pfVar3[2];
        pfVar18 = pfVar18 + puVar1[0xc];
        fVar113 = pfVar18[1];
        fVar114 = pfVar18[2];
        pfVar19 = ppfVar17[puVar1[0x11]];
        pfVar4 = pfVar19 + puVar1[1];
        pfVar5 = pfVar19 + puVar1[5];
        pfVar6 = pfVar19 + puVar1[9];
        fVar184 = pfVar6[2];
        pfVar19 = pfVar19 + puVar1[0xd];
        fVar128 = pfVar19[1];
        fVar129 = pfVar19[2];
        pfVar20 = ppfVar17[puVar1[0x12]];
        pfVar7 = pfVar20 + puVar1[2];
        pfVar8 = pfVar20 + puVar1[6];
        auVar93 = *(undefined1 (*) [16])(pfVar20 + puVar1[0xe]);
        pfVar21 = ppfVar17[puVar1[0x13]];
        pfVar9 = pfVar21 + puVar1[3];
        fVar131 = *pfVar9;
        pfVar10 = pfVar21 + puVar1[7];
        pfVar11 = pfVar21 + puVar1[0xf];
        fVar133 = pfVar11[1];
        local_1168 = CONCAT44(*pfVar6,*pfVar3);
        local_1158 = CONCAT44(pfVar21[puVar1[0xb]],pfVar20[puVar1[10]]);
        local_1178 = pfVar3[1];
        fStack_1174 = pfVar6[1];
        fStack_1170 = (pfVar20 + puVar1[10])[1];
        fStack_116c = (pfVar21 + puVar1[0xb])[1];
        fStack_13c0 = auVar93._8_4_;
        fVar149 = *(float *)(ray + k * 4);
        fVar103 = *(float *)(ray + k * 4 + 0x10);
        fVar150 = *pfVar12 - fVar149;
        fVar156 = *pfVar4 - fVar149;
        fVar157 = fStack_13d0 - fVar149;
        fVar158 = fStack_13cc - fVar149;
        local_11d8 = pfVar12[1] - fVar103;
        fStack_11d4 = pfVar4[1] - fVar103;
        fStack_11d0 = pfVar7[1] - fVar103;
        fStack_11cc = pfVar9[1] - fVar103;
        local_1198 = CONCAT44(*pfVar5,*pfVar2);
        fVar159 = *pfVar2 - fVar149;
        fVar162 = *pfVar5 - fVar149;
        fVar163 = *pfVar8 - fVar149;
        fVar164 = *pfVar10 - fVar149;
        local_11b8 = CONCAT44(*pfVar19,*pfVar18);
        fVar140 = *pfVar18 - fVar149;
        fVar147 = *pfVar19 - fVar149;
        fVar148 = *pfVar7 - fVar149;
        fVar149 = *pfVar11 - fVar149;
        local_11a8 = pfVar2[1];
        fStack_11a4 = pfVar5[1];
        fStack_11a0 = pfVar8[1];
        fStack_119c = pfVar10[1];
        fVar165 = pfVar2[1] - fVar103;
        fVar167 = pfVar5[1] - fVar103;
        fVar169 = pfVar8[1] - fVar103;
        fVar171 = pfVar10[1] - fVar103;
        fVar85 = fVar113 - fVar103;
        fVar100 = fVar128 - fVar103;
        fVar102 = fVar131 - fVar103;
        fVar103 = fVar133 - fVar103;
        fVar84 = *(float *)(ray + k * 4 + 0x20);
        local_11c8 = pfVar12[2] - fVar84;
        fStack_11c4 = pfVar4[2] - fVar84;
        fStack_11c0 = pfVar7[2] - fVar84;
        fStack_11bc = pfVar9[2] - fVar84;
        local_1188 = pfVar2[2];
        fStack_1184 = pfVar5[2];
        fStack_1180 = pfVar8[2];
        fStack_117c = pfVar10[2];
        fVar112 = pfVar2[2] - fVar84;
        fVar127 = pfVar5[2] - fVar84;
        fVar130 = pfVar8[2] - fVar84;
        fVar132 = pfVar10[2] - fVar84;
        fVar51 = fVar114 - fVar84;
        fVar82 = fVar129 - fVar84;
        fVar83 = fStack_13c0 - fVar84;
        fVar84 = pfVar11[2] - fVar84;
        local_11e8 = fVar140 - fVar150;
        fStack_11e4 = fVar147 - fVar156;
        fStack_11e0 = fVar148 - fVar157;
        fStack_11dc = fVar149 - fVar158;
        local_1208 = fVar85 - local_11d8;
        fStack_1204 = fVar100 - fStack_11d4;
        fStack_1200 = fVar102 - fStack_11d0;
        fStack_11fc = fVar103 - fStack_11cc;
        local_11f8._0_4_ = fVar51 - local_11c8;
        local_11f8._4_4_ = fVar82 - fStack_11c4;
        fStack_11f0 = fVar83 - fStack_11c0;
        fStack_11ec = fVar84 - fStack_11bc;
        fVar185 = *(float *)(ray + k * 4 + 0x50);
        local_1218 = *(float *)(ray + k * 4 + 0x60);
        fVar134 = *(float *)(ray + k * 4 + 0x40);
        fVar104 = (local_1208 * (fVar51 + local_11c8) -
                  (fVar85 + local_11d8) * (float)local_11f8._0_4_) * fVar134 +
                  ((fVar140 + fVar150) * (float)local_11f8._0_4_ -
                  (fVar51 + local_11c8) * local_11e8) * fVar185 +
                  (local_11e8 * (fVar85 + local_11d8) - (fVar140 + fVar150) * local_1208) *
                  local_1218;
        fVar111 = (fStack_1204 * (fVar82 + fStack_11c4) -
                  (fVar100 + fStack_11d4) * (float)local_11f8._4_4_) * fVar134 +
                  ((fVar147 + fVar156) * (float)local_11f8._4_4_ -
                  (fVar82 + fStack_11c4) * fStack_11e4) * fVar185 +
                  (fStack_11e4 * (fVar100 + fStack_11d4) - (fVar147 + fVar156) * fStack_1204) *
                  local_1218;
        local_fd8._0_8_ = CONCAT44(fVar111,fVar104);
        local_fd8._8_4_ =
             (fStack_1200 * (fVar83 + fStack_11c0) - (fVar102 + fStack_11d0) * fStack_11f0) *
             fVar134 + ((fVar148 + fVar157) * fStack_11f0 - (fVar83 + fStack_11c0) * fStack_11e0) *
                       fVar185 + (fStack_11e0 * (fVar102 + fStack_11d0) -
                                 (fVar148 + fVar157) * fStack_1200) * local_1218;
        local_fd8._12_4_ =
             (fStack_11fc * (fVar84 + fStack_11bc) - (fVar103 + fStack_11cc) * fStack_11ec) *
             fVar134 + ((fVar149 + fVar158) * fStack_11ec - (fVar84 + fStack_11bc) * fStack_11dc) *
                       fVar185 + (fStack_11dc * (fVar103 + fStack_11cc) -
                                 (fVar149 + fVar158) * fStack_11fc) * local_1218;
        fVar166 = fVar150 - fVar159;
        fVar168 = fVar156 - fVar162;
        fVar170 = fVar157 - fVar163;
        fVar172 = fVar158 - fVar164;
        fVar186 = local_11d8 - fVar165;
        fVar188 = fStack_11d4 - fVar167;
        fVar189 = fStack_11d0 - fVar169;
        fVar190 = fStack_11cc - fVar171;
        local_f88 = local_11c8 - fVar112;
        fStack_f84 = fStack_11c4 - fVar127;
        fStack_f80 = fStack_11c0 - fVar130;
        fStack_f7c = fStack_11bc - fVar132;
        local_fb8._0_4_ =
             (fVar186 * (local_11c8 + fVar112) - (local_11d8 + fVar165) * local_f88) * fVar134 +
             ((fVar150 + fVar159) * local_f88 - (local_11c8 + fVar112) * fVar166) * fVar185 +
             (fVar166 * (local_11d8 + fVar165) - (fVar150 + fVar159) * fVar186) * local_1218;
        local_fb8._4_4_ =
             (fVar188 * (fStack_11c4 + fVar127) - (fStack_11d4 + fVar167) * fStack_f84) * fVar134 +
             ((fVar156 + fVar162) * fStack_f84 - (fStack_11c4 + fVar127) * fVar168) * fVar185 +
             (fVar168 * (fStack_11d4 + fVar167) - (fVar156 + fVar162) * fVar188) * local_1218;
        local_fb8._8_4_ =
             (fVar189 * (fStack_11c0 + fVar130) - (fStack_11d0 + fVar169) * fStack_f80) * fVar134 +
             ((fVar157 + fVar163) * fStack_f80 - (fStack_11c0 + fVar130) * fVar170) * fVar185 +
             (fVar170 * (fStack_11d0 + fVar169) - (fVar157 + fVar163) * fVar189) * local_1218;
        local_fb8._12_4_ =
             (fVar190 * (fStack_11bc + fVar132) - (fStack_11cc + fVar171) * fStack_f7c) * fVar134 +
             ((fVar158 + fVar164) * fStack_f7c - (fStack_11bc + fVar132) * fVar172) * fVar185 +
             (fVar172 * (fStack_11cc + fVar171) - (fVar158 + fVar164) * fVar190) * local_1218;
        fVar191 = fVar159 - fVar140;
        fVar194 = fVar162 - fVar147;
        fVar195 = fVar163 - fVar148;
        fVar196 = fVar164 - fVar149;
        fVar197 = fVar165 - fVar85;
        fVar198 = fVar167 - fVar100;
        fVar199 = fVar169 - fVar102;
        fVar200 = fVar171 - fVar103;
        fVar173 = fVar112 - fVar51;
        fVar176 = fVar127 - fVar82;
        fVar177 = fVar130 - fVar83;
        fVar178 = fVar132 - fVar84;
        fStack_1214 = local_1218;
        fStack_1210 = local_1218;
        fStack_120c = local_1218;
        auVar119._0_4_ =
             (fVar197 * (fVar51 + fVar112) - (fVar85 + fVar165) * fVar173) * fVar134 +
             ((fVar140 + fVar159) * fVar173 - (fVar51 + fVar112) * fVar191) * fVar185 +
             (fVar191 * (fVar85 + fVar165) - (fVar140 + fVar159) * fVar197) * local_1218;
        auVar119._4_4_ =
             (fVar198 * (fVar82 + fVar127) - (fVar100 + fVar167) * fVar176) * fVar134 +
             ((fVar147 + fVar162) * fVar176 - (fVar82 + fVar127) * fVar194) * fVar185 +
             (fVar194 * (fVar100 + fVar167) - (fVar147 + fVar162) * fVar198) * local_1218;
        auVar119._8_4_ =
             (fVar199 * (fVar83 + fVar130) - (fVar102 + fVar169) * fVar177) * fVar134 +
             ((fVar148 + fVar163) * fVar177 - (fVar83 + fVar130) * fVar195) * fVar185 +
             (fVar195 * (fVar102 + fVar169) - (fVar148 + fVar163) * fVar199) * local_1218;
        auVar119._12_4_ =
             (fVar200 * (fVar84 + fVar132) - (fVar103 + fVar171) * fVar178) * fVar134 +
             ((fVar149 + fVar164) * fVar178 - (fVar84 + fVar132) * fVar196) * fVar185 +
             (fVar196 * (fVar103 + fVar171) - (fVar149 + fVar164) * fVar200) * local_1218;
        local_fc8 = fVar104 + local_fb8._0_4_ + auVar119._0_4_;
        fStack_fc4 = fVar111 + local_fb8._4_4_ + auVar119._4_4_;
        fStack_fc0 = local_fd8._8_4_ + local_fb8._8_4_ + auVar119._8_4_;
        fStack_fbc = local_fd8._12_4_ + local_fb8._12_4_ + auVar119._12_4_;
        auVar60._8_4_ = local_fd8._8_4_;
        auVar60._0_8_ = local_fd8._0_8_;
        auVar60._12_4_ = local_fd8._12_4_;
        auVar61 = minps(auVar60,local_fb8);
        auVar61 = minps(auVar61,auVar119);
        auVar153._8_4_ = local_fd8._8_4_;
        auVar153._0_8_ = local_fd8._0_8_;
        auVar153._12_4_ = local_fd8._12_4_;
        auVar52 = maxps(auVar153,local_fb8);
        auVar52 = maxps(auVar52,auVar119);
        fVar149 = ABS(local_fc8) * 1.1920929e-07;
        fVar103 = ABS(fStack_fc4) * 1.1920929e-07;
        fVar84 = ABS(fStack_fc0) * 1.1920929e-07;
        fVar51 = ABS(fStack_fbc) * 1.1920929e-07;
        auVar154._4_4_ = -(uint)(auVar52._4_4_ <= fVar103);
        auVar154._0_4_ = -(uint)(auVar52._0_4_ <= fVar149);
        auVar154._8_4_ = -(uint)(auVar52._8_4_ <= fVar84);
        auVar154._12_4_ = -(uint)(auVar52._12_4_ <= fVar51);
        auVar62._4_4_ = -(uint)(-fVar103 <= auVar61._4_4_);
        auVar62._0_4_ = -(uint)(-fVar149 <= auVar61._0_4_);
        auVar62._8_4_ = -(uint)(-fVar84 <= auVar61._8_4_);
        auVar62._12_4_ = -(uint)(-fVar51 <= auVar61._12_4_);
        auVar154 = auVar154 | auVar62;
        lVar23 = (sVar50 & 0xfffffffffffffff0) + lVar39;
        uVar42 = (undefined4)((ulong)lVar39 >> 0x20);
        uVar36 = movmskps((int)lVar39,auVar154);
        scene = pSVar43;
        if (uVar36 != 0) {
          local_f98 = fVar197;
          fStack_f94 = fVar198;
          fStack_f90 = fVar199;
          fStack_f8c = fVar200;
          local_fa8 = fVar173;
          fStack_fa4 = fVar176;
          fStack_fa0 = fVar177;
          fStack_f9c = fVar178;
          auVar187._0_4_ = fVar186 * fVar173 - fVar197 * local_f88;
          auVar187._4_4_ = fVar188 * fVar176 - fVar198 * fStack_f84;
          auVar187._8_4_ = fVar189 * fVar177 - fVar199 * fStack_f80;
          auVar187._12_4_ = fVar190 * fVar178 - fVar200 * fStack_f7c;
          auVar63._4_4_ =
               -(uint)(ABS(fVar188 * (float)local_11f8._4_4_) < ABS(fVar198 * fStack_f84));
          auVar63._0_4_ = -(uint)(ABS(fVar186 * (float)local_11f8._0_4_) < ABS(fVar197 * local_f88))
          ;
          auVar63._8_4_ = -(uint)(ABS(fVar189 * fStack_11f0) < ABS(fVar199 * fStack_f80));
          auVar63._12_4_ = -(uint)(ABS(fVar190 * fStack_11ec) < ABS(fVar200 * fStack_f7c));
          auVar27._4_4_ = fStack_1204 * fStack_f84 - fVar188 * (float)local_11f8._4_4_;
          auVar27._0_4_ = local_1208 * local_f88 - fVar186 * (float)local_11f8._0_4_;
          auVar27._8_4_ = fStack_1200 * fStack_f80 - fVar189 * fStack_11f0;
          auVar27._12_4_ = fStack_11fc * fStack_f7c - fVar190 * fStack_11ec;
          local_1258 = blendvps(auVar187,auVar27,auVar63);
          auVar192._0_4_ = fVar191 * local_f88 - fVar166 * fVar173;
          auVar192._4_4_ = fVar194 * fStack_f84 - fVar168 * fVar176;
          auVar192._8_4_ = fVar195 * fStack_f80 - fVar170 * fVar177;
          auVar192._12_4_ = fVar196 * fStack_f7c - fVar172 * fVar178;
          auVar64._4_4_ = -(uint)(ABS(fStack_11e4 * fStack_f84) < ABS(fVar168 * fVar176));
          auVar64._0_4_ = -(uint)(ABS(local_11e8 * local_f88) < ABS(fVar166 * fVar173));
          auVar64._8_4_ = -(uint)(ABS(fStack_11e0 * fStack_f80) < ABS(fVar170 * fVar177));
          auVar64._12_4_ = -(uint)(ABS(fStack_11dc * fStack_f7c) < ABS(fVar172 * fVar178));
          auVar25._4_4_ = (float)local_11f8._4_4_ * fVar168 - fStack_11e4 * fStack_f84;
          auVar25._0_4_ = (float)local_11f8._0_4_ * fVar166 - local_11e8 * local_f88;
          auVar25._8_4_ = fStack_11f0 * fVar170 - fStack_11e0 * fStack_f80;
          auVar25._12_4_ = fStack_11ec * fVar172 - fStack_11dc * fStack_f7c;
          local_1248 = blendvps(auVar192,auVar25,auVar64);
          auVar145._0_4_ = local_11e8 * fVar186 - fVar166 * local_1208;
          auVar145._4_4_ = fStack_11e4 * fVar188 - fVar168 * fStack_1204;
          auVar145._8_4_ = fStack_11e0 * fVar189 - fVar170 * fStack_1200;
          auVar145._12_4_ = fStack_11dc * fVar190 - fVar172 * fStack_11fc;
          auVar160._0_4_ = fVar166 * fVar197 - fVar191 * fVar186;
          auVar160._4_4_ = fVar168 * fVar198 - fVar194 * fVar188;
          auVar160._8_4_ = fVar170 * fVar199 - fVar195 * fVar189;
          auVar160._12_4_ = fVar172 * fVar200 - fVar196 * fVar190;
          auVar65._4_4_ = -(uint)(ABS(fVar168 * fStack_1204) < ABS(fVar194 * fVar188));
          auVar65._0_4_ = -(uint)(ABS(fVar166 * local_1208) < ABS(fVar191 * fVar186));
          auVar65._8_4_ = -(uint)(ABS(fVar170 * fStack_1200) < ABS(fVar195 * fVar189));
          auVar65._12_4_ = -(uint)(ABS(fVar172 * fStack_11fc) < ABS(fVar196 * fVar190));
          local_1238 = blendvps(auVar160,auVar145,auVar65);
          fVar149 = fVar134 * local_1258._0_4_ +
                    fVar185 * local_1248._0_4_ + local_1218 * local_1238._0_4_;
          fVar103 = fVar134 * local_1258._4_4_ +
                    fVar185 * local_1248._4_4_ + local_1218 * local_1238._4_4_;
          fVar84 = fVar134 * local_1258._8_4_ +
                   fVar185 * local_1248._8_4_ + local_1218 * local_1238._8_4_;
          fVar185 = fVar134 * local_1258._12_4_ +
                    fVar185 * local_1248._12_4_ + local_1218 * local_1238._12_4_;
          auVar180._0_4_ = fVar149 + fVar149;
          auVar180._4_4_ = fVar103 + fVar103;
          auVar180._8_4_ = fVar84 + fVar84;
          auVar180._12_4_ = fVar185 + fVar185;
          auVar66._0_4_ = local_11c8 * local_1238._0_4_;
          auVar66._4_4_ = fStack_11c4 * local_1238._4_4_;
          auVar66._8_4_ = fStack_11c0 * local_1238._8_4_;
          auVar66._12_4_ = fStack_11bc * local_1238._12_4_;
          fVar134 = fVar150 * local_1258._0_4_ + local_11d8 * local_1248._0_4_ + auVar66._0_4_;
          fVar51 = fVar156 * local_1258._4_4_ + fStack_11d4 * local_1248._4_4_ + auVar66._4_4_;
          fVar82 = fVar157 * local_1258._8_4_ + fStack_11d0 * local_1248._8_4_ + auVar66._8_4_;
          fVar83 = fVar158 * local_1258._12_4_ + fStack_11cc * local_1248._12_4_ + auVar66._12_4_;
          auVar61 = rcpps(auVar66,auVar180);
          fVar149 = auVar61._0_4_;
          fVar103 = auVar61._4_4_;
          fVar84 = auVar61._8_4_;
          fVar185 = auVar61._12_4_;
          auVar136._0_4_ = fVar134 + fVar134;
          auVar136._4_4_ = fVar51 + fVar51;
          auVar136._8_4_ = fVar82 + fVar82;
          auVar136._12_4_ = fVar83 + fVar83;
          auVar174._0_4_ = ((1.0 - auVar180._0_4_ * fVar149) * fVar149 + fVar149) * auVar136._0_4_;
          auVar174._4_4_ = ((1.0 - auVar180._4_4_ * fVar103) * fVar103 + fVar103) * auVar136._4_4_;
          auVar174._8_4_ = ((1.0 - auVar180._8_4_ * fVar84) * fVar84 + fVar84) * auVar136._8_4_;
          auVar174._12_4_ =
               ((1.0 - auVar180._12_4_ * fVar185) * fVar185 + fVar185) * auVar136._12_4_;
          fVar149 = *(float *)(ray + k * 4 + 0x80);
          fVar103 = *(float *)(ray + k * 4 + 0x30);
          auVar87._0_4_ =
               -(uint)(auVar174._0_4_ <= fVar149 && fVar103 <= auVar174._0_4_) & auVar154._0_4_;
          auVar87._4_4_ =
               -(uint)(auVar174._4_4_ <= fVar149 && fVar103 <= auVar174._4_4_) & auVar154._4_4_;
          auVar87._8_4_ =
               -(uint)(auVar174._8_4_ <= fVar149 && fVar103 <= auVar174._8_4_) & auVar154._8_4_;
          auVar87._12_4_ =
               -(uint)(auVar174._12_4_ <= fVar149 && fVar103 <= auVar174._12_4_) & auVar154._12_4_;
          uVar36 = movmskps(uVar36,auVar87);
          if (uVar36 != 0) {
            uVar86 = auVar87._0_4_ & -(uint)(auVar180._0_4_ != 0.0);
            uVar101 = auVar87._4_4_ & -(uint)(auVar180._4_4_ != 0.0);
            valid.field_0._0_8_ = CONCAT44(uVar101,uVar86);
            valid.field_0.i[2] = auVar87._8_4_ & -(uint)(auVar180._8_4_ != 0.0);
            valid.field_0.i[3] = auVar87._12_4_ & -(uint)(auVar180._12_4_ != 0.0);
            uVar36 = movmskps(uVar36,(undefined1  [16])valid.field_0);
            if (uVar36 != 0) {
              tNear.field_0.v[2] = local_fd8._8_4_;
              tNear.field_0._0_8_ = local_fd8._0_8_;
              tNear.field_0.v[3] = local_fd8._12_4_;
              auVar34._4_4_ = fStack_fc4;
              auVar34._0_4_ = local_fc8;
              auVar34._8_4_ = fStack_fc0;
              auVar34._12_4_ = fStack_fbc;
              local_1268 = auVar174;
              local_1228._8_8_ = uStack_fe0;
              local_1228._0_8_ = local_fe8;
              auVar61 = rcpps(auVar136,auVar34);
              fVar103 = auVar61._0_4_;
              fVar84 = auVar61._4_4_;
              fVar185 = auVar61._8_4_;
              fVar134 = auVar61._12_4_;
              fVar51 = (float)DAT_01feca10;
              fVar82 = DAT_01feca10._4_4_;
              fVar83 = DAT_01feca10._12_4_;
              fVar149 = DAT_01feca10._8_4_;
              fVar103 = (float)(-(uint)(1e-18 <= ABS(local_fc8)) &
                               (uint)((fVar51 - local_fc8 * fVar103) * fVar103 + fVar103));
              fVar84 = (float)(-(uint)(1e-18 <= ABS(fStack_fc4)) &
                              (uint)((fVar82 - fStack_fc4 * fVar84) * fVar84 + fVar84));
              fVar185 = (float)(-(uint)(1e-18 <= ABS(fStack_fc0)) &
                               (uint)((fVar149 - fStack_fc0 * fVar185) * fVar185 + fVar185));
              fVar134 = (float)(-(uint)(1e-18 <= ABS(fStack_fbc)) &
                               (uint)((fVar83 - fStack_fbc * fVar134) * fVar134 + fVar134));
              auVar181._0_4_ = fVar104 * fVar103;
              auVar181._4_4_ = fVar111 * fVar84;
              auVar181._8_4_ = local_fd8._8_4_ * fVar185;
              auVar181._12_4_ = local_fd8._12_4_ * fVar134;
              auVar52 = minps(auVar181,_DAT_01feca10);
              auVar120._0_4_ = fVar103 * local_fb8._0_4_;
              auVar120._4_4_ = fVar84 * local_fb8._4_4_;
              auVar120._8_4_ = fVar185 * local_fb8._8_4_;
              auVar120._12_4_ = fVar134 * local_fb8._12_4_;
              auVar61 = minps(auVar120,_DAT_01feca10);
              auVar109._0_4_ = fVar51 - auVar52._0_4_;
              auVar109._4_4_ = fVar82 - auVar52._4_4_;
              auVar109._8_4_ = fVar149 - auVar52._8_4_;
              auVar109._12_4_ = fVar83 - auVar52._12_4_;
              auVar137._0_4_ = fVar51 - auVar61._0_4_;
              auVar137._4_4_ = fVar82 - auVar61._4_4_;
              auVar137._8_4_ = fVar149 - auVar61._8_4_;
              auVar137._12_4_ = fVar83 - auVar61._12_4_;
              local_1288 = blendvps(auVar52,auVar109,local_1228);
              local_1278 = blendvps(auVar61,auVar137,local_1228);
              auVar67._8_4_ = valid.field_0.i[2];
              auVar67._0_8_ = valid.field_0._0_8_;
              auVar67._12_4_ = valid.field_0.i[3];
              auVar52 = blendvps(_DAT_01feb9f0,auVar174,auVar67);
              auVar121._4_4_ = auVar52._0_4_;
              auVar121._0_4_ = auVar52._4_4_;
              auVar121._8_4_ = auVar52._12_4_;
              auVar121._12_4_ = auVar52._8_4_;
              auVar61 = minps(auVar121,auVar52);
              auVar68._0_8_ = auVar61._8_8_;
              auVar68._8_4_ = auVar61._0_4_;
              auVar68._12_4_ = auVar61._4_4_;
              auVar61 = minps(auVar68,auVar61);
              auVar69._0_8_ =
                   CONCAT44(-(uint)(auVar61._4_4_ == auVar52._4_4_) & uVar101,
                            -(uint)(auVar61._0_4_ == auVar52._0_4_) & uVar86);
              auVar69._8_4_ = -(uint)(auVar61._8_4_ == auVar52._8_4_) & valid.field_0.i[2];
              auVar69._12_4_ = -(uint)(auVar61._12_4_ == auVar52._12_4_) & valid.field_0.i[3];
              iVar37 = movmskps(uVar36,auVar69);
              aVar88 = valid.field_0;
              if (iVar37 != 0) {
                aVar88.i[2] = auVar69._8_4_;
                aVar88._0_8_ = auVar69._0_8_;
                aVar88.i[3] = auVar69._12_4_;
              }
              uVar38 = movmskps(iVar37,(undefined1  [16])aVar88);
              lVar39 = 0;
              if (CONCAT44(uVar42,uVar38) != 0) {
                for (; (CONCAT44(uVar42,uVar38) >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                }
              }
LAB_00291f55:
              uVar36 = puVar48[lVar39];
              pRVar40 = (RTCRayN *)(ulong)uVar36;
              pGVar22 = (pSVar43->geometries).items[(long)pRVar40].ptr;
              if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar39] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar42 = *(undefined4 *)(local_1288 + lVar39 * 4);
                  uVar38 = *(undefined4 *)(local_1278 + lVar39 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1268 + lVar39 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1258 + lVar39 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1248 + lVar39 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1238 + lVar39 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar42;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar38;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar23 + 0x50 + lVar39 * 4)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar36;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  uVar36 = context->user->instPrimID[0];
                  uVar42 = 0;
                  *(uint *)(ray + k * 4 + 0x140) = uVar36;
                  goto LAB_002923da;
                }
                local_10d8 = *(undefined4 *)(local_1288 + lVar39 * 4);
                local_10c8 = *(undefined4 *)(local_1278 + lVar39 * 4);
                local_1108._4_4_ = *(undefined4 *)(local_1258 + lVar39 * 4);
                local_10f8._4_4_ = *(undefined4 *)(local_1248 + lVar39 * 4);
                local_10a8._4_4_ = uVar36;
                local_10a8._0_4_ = uVar36;
                local_10a8._8_4_ = uVar36;
                local_10a8._12_4_ = uVar36;
                uVar42 = *(undefined4 *)(lVar23 + 0x50 + lVar39 * 4);
                local_10b8._4_4_ = uVar42;
                local_10b8._0_4_ = uVar42;
                local_10b8._8_4_ = uVar42;
                local_10b8._12_4_ = uVar42;
                local_10e8 = *(undefined4 *)(local_1238 + lVar39 * 4);
                local_1108._0_4_ = local_1108._4_4_;
                local_1108._8_4_ = local_1108._4_4_;
                local_1108._12_4_ = local_1108._4_4_;
                local_10f8._0_4_ = local_10f8._4_4_;
                local_10f8._8_4_ = local_10f8._4_4_;
                local_10f8._12_4_ = local_10f8._4_4_;
                uStack_10e4 = local_10e8;
                uStack_10e0 = local_10e8;
                uStack_10dc = local_10e8;
                uStack_10d4 = local_10d8;
                uStack_10d0 = local_10d8;
                uStack_10cc = local_10d8;
                uStack_10c4 = local_10c8;
                uStack_10c0 = local_10c8;
                uStack_10bc = local_10c8;
                local_1098 = context->user->instID[0];
                uStack_1094 = local_1098;
                uStack_1090 = local_1098;
                uStack_108c = local_1098;
                local_1088 = context->user->instPrimID[0];
                uStack_1084 = local_1088;
                uStack_1080 = local_1088;
                uStack_107c = local_1088;
                uVar42 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1268 + lVar39 * 4);
                local_1378 = *(undefined8 *)(mm_lookupmask_ps + lVar41);
                uStack_1370 = *(undefined8 *)(mm_lookupmask_ps + lVar41 + 8);
                args.valid = (int *)&local_1378;
                args.geometryUserPtr = pGVar22->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)local_1108;
                args.N = 4;
                pRVar40 = (RTCRayN *)pGVar22->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (pRVar40 != (RTCRayN *)0x0) {
                  pRVar40 = (RTCRayN *)(*(code *)pRVar40)(&args);
                  pSVar43 = scene;
                }
                auVar29._8_8_ = uStack_1370;
                auVar29._0_8_ = local_1378;
                if (auVar29 == (undefined1  [16])0x0) {
                  auVar89._8_4_ = 0xffffffff;
                  auVar89._0_8_ = 0xffffffffffffffff;
                  auVar89._12_4_ = 0xffffffff;
                  auVar89 = auVar89 ^ _DAT_01febe20;
                }
                else {
                  pRVar40 = (RTCRayN *)context->args->filter;
                  if ((pRVar40 != (RTCRayN *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar22->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    pRVar40 = (RTCRayN *)(*(code *)pRVar40)(&args);
                    pSVar43 = scene;
                  }
                  auVar30._8_8_ = uStack_1370;
                  auVar30._0_8_ = local_1378;
                  auVar70._0_4_ = -(uint)((int)local_1378 == 0);
                  auVar70._4_4_ = -(uint)((int)((ulong)local_1378 >> 0x20) == 0);
                  auVar70._8_4_ = -(uint)((int)uStack_1370 == 0);
                  auVar70._12_4_ = -(uint)((int)((ulong)uStack_1370 >> 0x20) == 0);
                  auVar89 = auVar70 ^ _DAT_01febe20;
                  if (auVar30 != (undefined1  [16])0x0) {
                    auVar61 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar70);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar70);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar70);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar70);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar70);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar70);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar70);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar70);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar70);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar61;
                    pRVar40 = args.ray;
                  }
                }
                if ((_DAT_01fecb20 & auVar89) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar42;
                }
                valid.field_0.v[lVar39] = 0.0;
                fVar149 = *(float *)(ray + k * 4 + 0x80);
                valid.field_0.i[1] = -(uint)(auVar174._4_4_ <= fVar149) & valid.field_0.i[1];
                valid.field_0.i[0] = -(uint)(auVar174._0_4_ <= fVar149) & valid.field_0.i[0];
                valid.field_0.i[2] = -(uint)(auVar174._8_4_ <= fVar149) & valid.field_0.i[2];
                valid.field_0.i[3] = -(uint)(auVar174._12_4_ <= fVar149) & valid.field_0.i[3];
              }
              uVar42 = (undefined4)((ulong)pRVar40 >> 0x20);
              uVar36 = movmskps((int)pRVar40,(undefined1  [16])valid.field_0);
              if (uVar36 == 0) goto LAB_002923da;
              auVar52 = blendvps(_DAT_01feb9f0,auVar174,(undefined1  [16])valid.field_0);
              auVar122._4_4_ = auVar52._0_4_;
              auVar122._0_4_ = auVar52._4_4_;
              auVar122._8_4_ = auVar52._12_4_;
              auVar122._12_4_ = auVar52._8_4_;
              auVar61 = minps(auVar122,auVar52);
              auVar90._0_8_ = auVar61._8_8_;
              auVar90._8_4_ = auVar61._0_4_;
              auVar90._12_4_ = auVar61._4_4_;
              auVar61 = minps(auVar90,auVar61);
              auVar91._0_8_ =
                   CONCAT44(-(uint)(auVar61._4_4_ == auVar52._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar61._0_4_ == auVar52._0_4_) & valid.field_0._0_4_);
              auVar91._8_4_ = -(uint)(auVar61._8_4_ == auVar52._8_4_) & valid.field_0._8_4_;
              auVar91._12_4_ = -(uint)(auVar61._12_4_ == auVar52._12_4_) & valid.field_0._12_4_;
              iVar37 = movmskps(uVar36,auVar91);
              aVar71 = valid.field_0;
              if (iVar37 != 0) {
                aVar71.i[2] = auVar91._8_4_;
                aVar71._0_8_ = auVar91._0_8_;
                aVar71.i[3] = auVar91._12_4_;
              }
              uVar38 = movmskps(iVar37,(undefined1  [16])aVar71);
              lVar39 = 0;
              if (CONCAT44(uVar42,uVar38) != 0) {
                for (; (CONCAT44(uVar42,uVar38) >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                }
              }
              goto LAB_00291f55;
            }
          }
        }
LAB_002923da:
        fVar149 = *(float *)(ray + k * 4);
        fVar103 = *(float *)(ray + k * 4 + 0x10);
        fVar84 = *(float *)(ray + k * 4 + 0x20);
        fStack_13d0 = *(float *)(ray + k * 4 + 0x40);
        fVar185 = *(float *)(ray + k * 4 + 0x50);
        local_1168._0_4_ = (float)local_1168 - fVar149;
        local_1168._4_4_ = local_1168._4_4_ - fVar149;
        fStack_1160 = fStack_1160 - fVar149;
        fStack_115c = fStack_115c - fVar149;
        local_1178 = local_1178 - fVar103;
        fStack_1174 = fStack_1174 - fVar103;
        fStack_1170 = fStack_1170 - fVar103;
        fStack_116c = fStack_116c - fVar103;
        fVar179 = fVar179 - fVar84;
        fVar184 = fVar184 - fVar84;
        fStack_1310 = fStack_1310 - fVar84;
        fStack_130c = fStack_130c - fVar84;
        fVar140 = (float)local_11b8 - fVar149;
        fVar147 = local_11b8._4_4_ - fVar149;
        fVar148 = fStack_11b0 - fVar149;
        fVar150 = fStack_11ac - fVar149;
        fVar113 = fVar113 - fVar103;
        fVar128 = fVar128 - fVar103;
        fVar131 = fVar131 - fVar103;
        fVar133 = fVar133 - fVar103;
        fStack_13bc = auVar93._12_4_;
        fVar114 = fVar114 - fVar84;
        fVar129 = fVar129 - fVar84;
        fStack_13c0 = fStack_13c0 - fVar84;
        fStack_13bc = fStack_13bc - fVar84;
        fVar156 = (float)local_1198 - fVar149;
        fVar157 = local_1198._4_4_ - fVar149;
        fVar158 = fStack_1190 - fVar149;
        fVar149 = fStack_118c - fVar149;
        fVar51 = local_11a8 - fVar103;
        fVar82 = fStack_11a4 - fVar103;
        fVar83 = fStack_11a0 - fVar103;
        fVar103 = fStack_119c - fVar103;
        fVar102 = local_1188 - fVar84;
        fVar104 = fStack_1184 - fVar84;
        fVar111 = fStack_1180 - fVar84;
        fVar84 = fStack_117c - fVar84;
        fVar85 = fVar156 - (float)local_1168;
        fVar100 = fVar157 - local_1168._4_4_;
        fStack_1190 = fVar158 - fStack_1160;
        fStack_118c = fVar149 - fStack_115c;
        fVar159 = fVar51 - local_1178;
        fVar163 = fVar82 - fStack_1174;
        fStack_11b0 = fVar83 - fStack_1170;
        fStack_11ac = fVar103 - fStack_116c;
        local_11a8 = fVar102 - fVar179;
        fStack_11a4 = fVar104 - fVar184;
        fStack_11a0 = fVar111 - fStack_1310;
        fStack_119c = fVar84 - fStack_130c;
        local_1198 = CONCAT44(fVar100,fVar85);
        fVar134 = *(float *)(ray + k * 4 + 0x60);
        local_11b8 = CONCAT44(fVar163,fVar159);
        local_1188 = (float)local_1168 - fVar140;
        fStack_1184 = local_1168._4_4_ - fVar147;
        fStack_1180 = fStack_1160 - fVar148;
        fStack_117c = fStack_115c - fVar150;
        local_11c8 = local_1178 - fVar113;
        fStack_11c4 = fStack_1174 - fVar128;
        fStack_11c0 = fStack_1170 - fVar131;
        fStack_11bc = fStack_116c - fVar133;
        local_1218 = (fVar159 * (fVar102 + fVar179) - (fVar51 + local_1178) * local_11a8) *
                     fStack_13d0 +
                     ((fVar156 + (float)local_1168) * local_11a8 - (fVar102 + fVar179) * fVar85) *
                     fVar185 + (fVar85 * (fVar51 + local_1178) -
                               (fVar156 + (float)local_1168) * fVar159) * fVar134;
        fStack_1214 = (fVar163 * (fVar104 + fVar184) - (fVar82 + fStack_1174) * fStack_11a4) *
                      fStack_13d0 +
                      ((fVar157 + local_1168._4_4_) * fStack_11a4 - (fVar104 + fVar184) * fVar100) *
                      fVar185 + (fVar100 * (fVar82 + fStack_1174) -
                                (fVar157 + local_1168._4_4_) * fVar163) * fVar134;
        fStack_1210 = (fStack_11b0 * (fVar111 + fStack_1310) - (fVar83 + fStack_1170) * fStack_11a0)
                      * fStack_13d0 +
                      ((fVar158 + fStack_1160) * fStack_11a0 - (fVar111 + fStack_1310) * fStack_1190
                      ) * fVar185 +
                      (fStack_1190 * (fVar83 + fStack_1170) - (fVar158 + fStack_1160) * fStack_11b0)
                      * fVar134;
        fStack_120c = (fStack_11ac * (fVar84 + fStack_130c) - (fVar103 + fStack_116c) * fStack_119c)
                      * fStack_13d0 +
                      ((fVar149 + fStack_115c) * fStack_119c - (fVar84 + fStack_130c) * fStack_118c)
                      * fVar185 +
                      (fStack_118c * (fVar103 + fStack_116c) - (fVar149 + fStack_115c) * fStack_11ac
                      ) * fVar134;
        fVar162 = fVar179 - fVar114;
        fVar164 = fVar184 - fVar129;
        fVar165 = fStack_1310 - fStack_13c0;
        fVar166 = fStack_130c - fStack_13bc;
        local_11f8._0_4_ =
             (local_11c8 * (fVar179 + fVar114) - (local_1178 + fVar113) * fVar162) * fStack_13d0 +
             (((float)local_1168 + fVar140) * fVar162 - (fVar179 + fVar114) * local_1188) * fVar185
             + (local_1188 * (local_1178 + fVar113) - ((float)local_1168 + fVar140) * local_11c8) *
               fVar134;
        local_11f8._4_4_ =
             (fStack_11c4 * (fVar184 + fVar129) - (fStack_1174 + fVar128) * fVar164) * fStack_13d0 +
             ((local_1168._4_4_ + fVar147) * fVar164 - (fVar184 + fVar129) * fStack_1184) * fVar185
             + (fStack_1184 * (fStack_1174 + fVar128) - (local_1168._4_4_ + fVar147) * fStack_11c4)
               * fVar134;
        fStack_11f0 = (fStack_11c0 * (fStack_1310 + fStack_13c0) - (fStack_1170 + fVar131) * fVar165
                      ) * fStack_13d0 +
                      ((fStack_1160 + fVar148) * fVar165 - (fStack_1310 + fStack_13c0) * fStack_1180
                      ) * fVar185 +
                      (fStack_1180 * (fStack_1170 + fVar131) - (fStack_1160 + fVar148) * fStack_11c0
                      ) * fVar134;
        fStack_11ec = (fStack_11bc * (fStack_130c + fStack_13bc) - (fStack_116c + fVar133) * fVar166
                      ) * fStack_13d0 +
                      ((fStack_115c + fVar150) * fVar166 - (fStack_130c + fStack_13bc) * fStack_117c
                      ) * fVar185 +
                      (fStack_117c * (fStack_116c + fVar133) - (fStack_115c + fVar150) * fStack_11bc
                      ) * fVar134;
        fVar112 = fVar140 - fVar156;
        fVar127 = fVar147 - fVar157;
        fVar130 = fVar148 - fVar158;
        fVar132 = fVar150 - fVar149;
        local_11d8 = fVar113 - fVar51;
        fStack_11d4 = fVar128 - fVar82;
        fStack_11d0 = fVar131 - fVar83;
        fStack_11cc = fVar133 - fVar103;
        local_11e8 = fVar114 - fVar102;
        fStack_11e4 = fVar129 - fVar104;
        fStack_11e0 = fStack_13c0 - fVar111;
        fStack_11dc = fStack_13bc - fVar84;
        auVar72._0_4_ =
             (local_11d8 * (fVar102 + fVar114) - (fVar51 + fVar113) * local_11e8) * fStack_13d0 +
             ((fVar156 + fVar140) * local_11e8 - (fVar102 + fVar114) * fVar112) * fVar185 +
             (fVar112 * (fVar51 + fVar113) - (fVar156 + fVar140) * local_11d8) * fVar134;
        auVar72._4_4_ =
             (fStack_11d4 * (fVar104 + fVar129) - (fVar82 + fVar128) * fStack_11e4) * fStack_13d0 +
             ((fVar157 + fVar147) * fStack_11e4 - (fVar104 + fVar129) * fVar127) * fVar185 +
             (fVar127 * (fVar82 + fVar128) - (fVar157 + fVar147) * fStack_11d4) * fVar134;
        auVar72._8_4_ =
             (fStack_11d0 * (fVar111 + fStack_13c0) - (fVar83 + fVar131) * fStack_11e0) *
             fStack_13d0 +
             ((fVar158 + fVar148) * fStack_11e0 - (fVar111 + fStack_13c0) * fVar130) * fVar185 +
             (fVar130 * (fVar83 + fVar131) - (fVar158 + fVar148) * fStack_11d0) * fVar134;
        auVar72._12_4_ =
             (fStack_11cc * (fVar84 + fStack_13bc) - (fVar103 + fVar133) * fStack_11dc) *
             fStack_13d0 +
             ((fVar149 + fVar150) * fStack_11dc - (fVar84 + fStack_13bc) * fVar132) * fVar185 +
             (fVar132 * (fVar103 + fVar133) - (fVar149 + fVar150) * fStack_11cc) * fVar134;
        local_1208 = local_1218 + (float)local_11f8._0_4_ + auVar72._0_4_;
        fStack_1204 = fStack_1214 + (float)local_11f8._4_4_ + auVar72._4_4_;
        fStack_1200 = fStack_1210 + fStack_11f0 + auVar72._8_4_;
        fStack_11fc = fStack_120c + fStack_11ec + auVar72._12_4_;
        auVar92._4_4_ = fStack_1214;
        auVar92._0_4_ = local_1218;
        auVar92._8_4_ = fStack_1210;
        auVar92._12_4_ = fStack_120c;
        auVar93 = minps(auVar92,_local_11f8);
        auVar93 = minps(auVar93,auVar72);
        auVar138._4_4_ = fStack_1214;
        auVar138._0_4_ = local_1218;
        auVar138._8_4_ = fStack_1210;
        auVar138._12_4_ = fStack_120c;
        auVar61 = maxps(auVar138,_local_11f8);
        auVar61 = maxps(auVar61,auVar72);
        fVar149 = ABS(local_1208) * 1.1920929e-07;
        fVar103 = ABS(fStack_1204) * 1.1920929e-07;
        fVar84 = ABS(fStack_1200) * 1.1920929e-07;
        fVar113 = ABS(fStack_11fc) * 1.1920929e-07;
        auVar139._4_4_ = -(uint)(auVar61._4_4_ <= fVar103);
        auVar139._0_4_ = -(uint)(auVar61._0_4_ <= fVar149);
        auVar139._8_4_ = -(uint)(auVar61._8_4_ <= fVar84);
        auVar139._12_4_ = -(uint)(auVar61._12_4_ <= fVar113);
        auVar94._4_4_ = -(uint)(-fVar103 <= auVar93._4_4_);
        auVar94._0_4_ = -(uint)(-fVar149 <= auVar93._0_4_);
        auVar94._8_4_ = -(uint)(-fVar84 <= auVar93._8_4_);
        auVar94._12_4_ = -(uint)(-fVar113 <= auVar93._12_4_);
        auVar139 = auVar139 | auVar94;
        iVar37 = movmskps(uVar36,auVar139);
        bvh = local_1368;
        if (iVar37 != 0) {
          auVar182._0_4_ = fVar159 * fVar162 - local_11c8 * local_11a8;
          auVar182._4_4_ = fVar163 * fVar164 - fStack_11c4 * fStack_11a4;
          auVar182._8_4_ = fStack_11b0 * fVar165 - fStack_11c0 * fStack_11a0;
          auVar182._12_4_ = fStack_11ac * fVar166 - fStack_11bc * fStack_119c;
          auVar146._0_4_ = local_11c8 * local_11e8 - local_11d8 * fVar162;
          auVar146._4_4_ = fStack_11c4 * fStack_11e4 - fStack_11d4 * fVar164;
          auVar146._8_4_ = fStack_11c0 * fStack_11e0 - fStack_11d0 * fVar165;
          auVar146._12_4_ = fStack_11bc * fStack_11dc - fStack_11cc * fVar166;
          auVar73._4_4_ = -(uint)(ABS(fStack_11c4 * fStack_11a4) < ABS(fStack_11d4 * fVar164));
          auVar73._0_4_ = -(uint)(ABS(local_11c8 * local_11a8) < ABS(local_11d8 * fVar162));
          auVar73._8_4_ = -(uint)(ABS(fStack_11c0 * fStack_11a0) < ABS(fStack_11d0 * fVar165));
          auVar73._12_4_ = -(uint)(ABS(fStack_11bc * fStack_119c) < ABS(fStack_11cc * fVar166));
          local_1258 = blendvps(auVar146,auVar182,auVar73);
          auVar183._0_4_ = fVar112 * fVar162 - local_1188 * local_11e8;
          auVar183._4_4_ = fVar127 * fVar164 - fStack_1184 * fStack_11e4;
          auVar183._8_4_ = fVar130 * fVar165 - fStack_1180 * fStack_11e0;
          auVar183._12_4_ = fVar132 * fVar166 - fStack_117c * fStack_11dc;
          auVar74._4_4_ = -(uint)(ABS(fVar100 * fVar164) < ABS(fStack_1184 * fStack_11e4));
          auVar74._0_4_ = -(uint)(ABS(fVar85 * fVar162) < ABS(local_1188 * local_11e8));
          auVar74._8_4_ = -(uint)(ABS(fStack_1190 * fVar165) < ABS(fStack_1180 * fStack_11e0));
          auVar74._12_4_ = -(uint)(ABS(fStack_118c * fVar166) < ABS(fStack_117c * fStack_11dc));
          auVar28._4_4_ = fStack_11a4 * fStack_1184 - fVar100 * fVar164;
          auVar28._0_4_ = local_11a8 * local_1188 - fVar85 * fVar162;
          auVar28._8_4_ = fStack_11a0 * fStack_1180 - fStack_1190 * fVar165;
          auVar28._12_4_ = fStack_119c * fStack_117c - fStack_118c * fVar166;
          local_1248 = blendvps(auVar183,auVar28,auVar74);
          auVar155._0_4_ = local_1188 * local_11d8 - fVar112 * local_11c8;
          auVar155._4_4_ = fStack_1184 * fStack_11d4 - fVar127 * fStack_11c4;
          auVar155._8_4_ = fStack_1180 * fStack_11d0 - fVar130 * fStack_11c0;
          auVar155._12_4_ = fStack_117c * fStack_11cc - fVar132 * fStack_11bc;
          auVar75._4_4_ = -(uint)(ABS(fStack_1184 * fVar163) < ABS(fVar127 * fStack_11c4));
          auVar75._0_4_ = -(uint)(ABS(local_1188 * fVar159) < ABS(fVar112 * local_11c8));
          auVar75._8_4_ = -(uint)(ABS(fStack_1180 * fStack_11b0) < ABS(fVar130 * fStack_11c0));
          auVar75._12_4_ = -(uint)(ABS(fStack_117c * fStack_11ac) < ABS(fVar132 * fStack_11bc));
          auVar24._4_4_ = fVar100 * fStack_11c4 - fStack_1184 * fVar163;
          auVar24._0_4_ = fVar85 * local_11c8 - local_1188 * fVar159;
          auVar24._8_4_ = fStack_1190 * fStack_11c0 - fStack_1180 * fStack_11b0;
          auVar24._12_4_ = fStack_118c * fStack_11bc - fStack_117c * fStack_11ac;
          local_1238 = blendvps(auVar155,auVar24,auVar75);
          fVar128 = fStack_13d0 * local_1258._0_4_ +
                    fVar185 * local_1248._0_4_ + fVar134 * local_1238._0_4_;
          fVar129 = fStack_13d0 * local_1258._4_4_ +
                    fVar185 * local_1248._4_4_ + fVar134 * local_1238._4_4_;
          fVar131 = fStack_13d0 * local_1258._8_4_ +
                    fVar185 * local_1248._8_4_ + fVar134 * local_1238._8_4_;
          fVar133 = fStack_13d0 * local_1258._12_4_ +
                    fVar185 * local_1248._12_4_ + fVar134 * local_1238._12_4_;
          fVar128 = fVar128 + fVar128;
          fVar129 = fVar129 + fVar129;
          fVar131 = fVar131 + fVar131;
          fVar133 = fVar133 + fVar133;
          auVar76._0_4_ = fVar179 * local_1238._0_4_;
          auVar76._4_4_ = fVar184 * local_1238._4_4_;
          auVar76._8_4_ = fStack_1310 * local_1238._8_4_;
          auVar76._12_4_ = fStack_130c * local_1238._12_4_;
          fVar134 = (float)local_1168 * local_1258._0_4_ +
                    local_1178 * local_1248._0_4_ + auVar76._0_4_;
          fVar179 = local_1168._4_4_ * local_1258._4_4_ +
                    fStack_1174 * local_1248._4_4_ + auVar76._4_4_;
          fVar113 = fStack_1160 * local_1258._8_4_ + fStack_1170 * local_1248._8_4_ + auVar76._8_4_;
          fVar114 = fStack_115c * local_1258._12_4_ +
                    fStack_116c * local_1248._12_4_ + auVar76._12_4_;
          auVar26._4_4_ = fVar129;
          auVar26._0_4_ = fVar128;
          auVar26._8_4_ = fVar131;
          auVar26._12_4_ = fVar133;
          auVar93 = rcpps(auVar76,auVar26);
          fVar149 = auVar93._0_4_;
          fVar103 = auVar93._4_4_;
          fVar84 = auVar93._8_4_;
          fVar185 = auVar93._12_4_;
          auVar123._0_4_ = fVar134 + fVar134;
          auVar123._4_4_ = fVar179 + fVar179;
          auVar123._8_4_ = fVar113 + fVar113;
          auVar123._12_4_ = fVar114 + fVar114;
          auVar161._0_4_ = ((1.0 - fVar128 * fVar149) * fVar149 + fVar149) * auVar123._0_4_;
          auVar161._4_4_ = ((1.0 - fVar129 * fVar103) * fVar103 + fVar103) * auVar123._4_4_;
          auVar161._8_4_ = ((1.0 - fVar131 * fVar84) * fVar84 + fVar84) * auVar123._8_4_;
          auVar161._12_4_ = ((1.0 - fVar133 * fVar185) * fVar185 + fVar185) * auVar123._12_4_;
          fVar149 = *(float *)(ray + k * 4 + 0x80);
          fVar103 = *(float *)(ray + k * 4 + 0x30);
          auVar95._0_4_ =
               -(uint)(auVar161._0_4_ <= fVar149 && fVar103 <= auVar161._0_4_) & auVar139._0_4_;
          auVar95._4_4_ =
               -(uint)(auVar161._4_4_ <= fVar149 && fVar103 <= auVar161._4_4_) & auVar139._4_4_;
          auVar95._8_4_ =
               -(uint)(auVar161._8_4_ <= fVar149 && fVar103 <= auVar161._8_4_) & auVar139._8_4_;
          auVar95._12_4_ =
               -(uint)(auVar161._12_4_ <= fVar149 && fVar103 <= auVar161._12_4_) & auVar139._12_4_;
          iVar37 = movmskps(iVar37,auVar95);
          if (iVar37 != 0) {
            uVar36 = auVar95._0_4_ & -(uint)(fVar128 != 0.0);
            uVar86 = auVar95._4_4_ & -(uint)(fVar129 != 0.0);
            valid.field_0._0_8_ = CONCAT44(uVar86,uVar36);
            valid.field_0.i[2] = auVar95._8_4_ & -(uint)(fVar131 != 0.0);
            valid.field_0.i[3] = auVar95._12_4_ & -(uint)(fVar133 != 0.0);
            iVar37 = movmskps(iVar37,(undefined1  [16])valid.field_0);
            if (iVar37 != 0) {
              tNear.field_0.v[1] = fStack_1214;
              tNear.field_0.v[0] = local_1218;
              tNear.field_0.v[2] = fStack_1210;
              tNear.field_0.v[3] = fStack_120c;
              auVar33._4_4_ = fStack_1204;
              auVar33._0_4_ = local_1208;
              auVar33._8_4_ = fStack_1200;
              auVar33._12_4_ = fStack_11fc;
              local_1268 = auVar161;
              local_1228._8_8_ = uStack_ff0;
              local_1228._0_8_ = local_ff8;
              pSVar43 = context->scene;
              auVar93 = rcpps(auVar123,auVar33);
              fVar103 = auVar93._0_4_;
              fVar84 = auVar93._4_4_;
              fVar185 = auVar93._8_4_;
              fVar134 = auVar93._12_4_;
              fVar179 = (float)DAT_01feca10;
              fVar113 = DAT_01feca10._4_4_;
              fVar114 = DAT_01feca10._12_4_;
              fVar149 = DAT_01feca10._8_4_;
              fVar103 = (float)(-(uint)(1e-18 <= ABS(local_1208)) &
                               (uint)((fVar179 - local_1208 * fVar103) * fVar103 + fVar103));
              fVar84 = (float)(-(uint)(1e-18 <= ABS(fStack_1204)) &
                              (uint)((fVar113 - fStack_1204 * fVar84) * fVar84 + fVar84));
              fVar185 = (float)(-(uint)(1e-18 <= ABS(fStack_1200)) &
                               (uint)((fVar149 - fStack_1200 * fVar185) * fVar185 + fVar185));
              fVar134 = (float)(-(uint)(1e-18 <= ABS(fStack_11fc)) &
                               (uint)((fVar114 - fStack_11fc * fVar134) * fVar134 + fVar134));
              auVar175._0_4_ = local_1218 * fVar103;
              auVar175._4_4_ = fStack_1214 * fVar84;
              auVar175._8_4_ = fStack_1210 * fVar185;
              auVar175._12_4_ = fStack_120c * fVar134;
              auVar93 = minps(auVar175,_DAT_01feca10);
              auVar193._0_4_ = fVar103 * (float)local_11f8._0_4_;
              auVar193._4_4_ = fVar84 * (float)local_11f8._4_4_;
              auVar193._8_4_ = fVar185 * fStack_11f0;
              auVar193._12_4_ = fVar134 * fStack_11ec;
              auVar61 = minps(auVar193,_DAT_01feca10);
              auVar110._0_4_ = fVar179 - auVar93._0_4_;
              auVar110._4_4_ = fVar113 - auVar93._4_4_;
              auVar110._8_4_ = fVar149 - auVar93._8_4_;
              auVar110._12_4_ = fVar114 - auVar93._12_4_;
              auVar124._0_4_ = fVar179 - auVar61._0_4_;
              auVar124._4_4_ = fVar113 - auVar61._4_4_;
              auVar124._8_4_ = fVar149 - auVar61._8_4_;
              auVar124._12_4_ = fVar114 - auVar61._12_4_;
              local_1288 = blendvps(auVar93,auVar110,local_1228);
              local_1278 = blendvps(auVar61,auVar124,local_1228);
              auVar77._8_4_ = valid.field_0.i[2];
              auVar77._0_8_ = valid.field_0._0_8_;
              auVar77._12_4_ = valid.field_0.i[3];
              auVar61 = blendvps(_DAT_01feb9f0,auVar161,auVar77);
              auVar125._4_4_ = auVar61._0_4_;
              auVar125._0_4_ = auVar61._4_4_;
              auVar125._8_4_ = auVar61._12_4_;
              auVar125._12_4_ = auVar61._8_4_;
              auVar93 = minps(auVar125,auVar61);
              auVar78._0_8_ = auVar93._8_8_;
              auVar78._8_4_ = auVar93._0_4_;
              auVar78._12_4_ = auVar93._4_4_;
              auVar93 = minps(auVar78,auVar93);
              auVar79._0_8_ =
                   CONCAT44(-(uint)(auVar93._4_4_ == auVar61._4_4_) & uVar86,
                            -(uint)(auVar93._0_4_ == auVar61._0_4_) & uVar36);
              auVar79._8_4_ = -(uint)(auVar93._8_4_ == auVar61._8_4_) & valid.field_0.i[2];
              auVar79._12_4_ = -(uint)(auVar93._12_4_ == auVar61._12_4_) & valid.field_0.i[3];
              iVar37 = movmskps(iVar37,auVar79);
              aVar96 = valid.field_0;
              if (iVar37 != 0) {
                aVar96.i[2] = auVar79._8_4_;
                aVar96._0_8_ = auVar79._0_8_;
                aVar96.i[3] = auVar79._12_4_;
              }
              uVar38 = movmskps(iVar37,(undefined1  [16])aVar96);
              lVar39 = 0;
              if (CONCAT44(uVar42,uVar38) != 0) {
                for (; (CONCAT44(uVar42,uVar38) >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                }
              }
LAB_002929a4:
              uVar36 = puVar48[lVar39];
              pRVar40 = (RTCRayN *)(ulong)uVar36;
              pGVar22 = (pSVar43->geometries).items[(long)pRVar40].ptr;
              if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar39] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar42 = *(undefined4 *)(local_1288 + lVar39 * 4);
                  uVar38 = *(undefined4 *)(local_1278 + lVar39 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1268 + lVar39 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1258 + lVar39 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1248 + lVar39 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1238 + lVar39 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar42;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar38;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar23 + 0x50 + lVar39 * 4)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar36;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_00292e41;
                }
                local_10d8 = *(undefined4 *)(local_1288 + lVar39 * 4);
                local_10c8 = *(undefined4 *)(local_1278 + lVar39 * 4);
                uVar42 = *(undefined4 *)(local_1258 + lVar39 * 4);
                uVar38 = *(undefined4 *)(local_1248 + lVar39 * 4);
                local_10a8._4_4_ = uVar36;
                local_10a8._0_4_ = uVar36;
                local_10a8._8_4_ = uVar36;
                local_10a8._12_4_ = uVar36;
                uVar14 = *(undefined4 *)(lVar23 + 0x50 + lVar39 * 4);
                local_10b8._4_4_ = uVar14;
                local_10b8._0_4_ = uVar14;
                local_10b8._8_4_ = uVar14;
                local_10b8._12_4_ = uVar14;
                local_1108._4_4_ = uVar42;
                local_1108._0_4_ = uVar42;
                local_1108._8_4_ = uVar42;
                local_1108._12_4_ = uVar42;
                local_10f8._4_4_ = uVar38;
                local_10f8._0_4_ = uVar38;
                local_10f8._8_4_ = uVar38;
                local_10f8._12_4_ = uVar38;
                local_10e8 = *(undefined4 *)(local_1238 + lVar39 * 4);
                uStack_10e4 = local_10e8;
                uStack_10e0 = local_10e8;
                uStack_10dc = local_10e8;
                uStack_10d4 = local_10d8;
                uStack_10d0 = local_10d8;
                uStack_10cc = local_10d8;
                uStack_10c4 = local_10c8;
                uStack_10c0 = local_10c8;
                uStack_10bc = local_10c8;
                local_1098 = context->user->instID[0];
                uStack_1094 = local_1098;
                uStack_1090 = local_1098;
                uStack_108c = local_1098;
                local_1088 = context->user->instPrimID[0];
                uStack_1084 = local_1088;
                uStack_1080 = local_1088;
                uStack_107c = local_1088;
                uVar42 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1268 + lVar39 * 4);
                local_1378 = *(undefined8 *)(mm_lookupmask_ps + lVar41);
                uStack_1370 = *(undefined8 *)(mm_lookupmask_ps + lVar41 + 8);
                args.valid = (int *)&local_1378;
                args.geometryUserPtr = pGVar22->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)local_1108;
                args.N = 4;
                pRVar40 = (RTCRayN *)pGVar22->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (pRVar40 != (RTCRayN *)0x0) {
                  pRVar40 = (RTCRayN *)(*(code *)pRVar40)(&args);
                  bvh = local_1368;
                }
                auVar31._8_8_ = uStack_1370;
                auVar31._0_8_ = local_1378;
                if (auVar31 == (undefined1  [16])0x0) {
                  auVar97._8_4_ = 0xffffffff;
                  auVar97._0_8_ = 0xffffffffffffffff;
                  auVar97._12_4_ = 0xffffffff;
                  auVar97 = auVar97 ^ _DAT_01febe20;
                }
                else {
                  pRVar40 = (RTCRayN *)context->args->filter;
                  if ((pRVar40 != (RTCRayN *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar22->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    pRVar40 = (RTCRayN *)(*(code *)pRVar40)(&args);
                    bvh = local_1368;
                  }
                  auVar32._8_8_ = uStack_1370;
                  auVar32._0_8_ = local_1378;
                  auVar80._0_4_ = -(uint)((int)local_1378 == 0);
                  auVar80._4_4_ = -(uint)((int)((ulong)local_1378 >> 0x20) == 0);
                  auVar80._8_4_ = -(uint)((int)uStack_1370 == 0);
                  auVar80._12_4_ = -(uint)((int)((ulong)uStack_1370 >> 0x20) == 0);
                  auVar97 = auVar80 ^ _DAT_01febe20;
                  if (auVar32 != (undefined1  [16])0x0) {
                    auVar93 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar80);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar93;
                    auVar93 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar80);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar93;
                    auVar93 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar80);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar93;
                    auVar93 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar80);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar93;
                    auVar93 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar80);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar93;
                    auVar93 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar80);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar93;
                    auVar93 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar80);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar93;
                    auVar93 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar80);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar93;
                    auVar93 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar80);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar93;
                    pRVar40 = args.ray;
                  }
                }
                if ((_DAT_01fecb20 & auVar97) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar42;
                }
                valid.field_0.v[lVar39] = 0.0;
                fVar149 = *(float *)(ray + k * 4 + 0x80);
                valid.field_0.i[1] = -(uint)(auVar161._4_4_ <= fVar149) & valid.field_0.i[1];
                valid.field_0.i[0] = -(uint)(auVar161._0_4_ <= fVar149) & valid.field_0.i[0];
                valid.field_0.i[2] = -(uint)(auVar161._8_4_ <= fVar149) & valid.field_0.i[2];
                valid.field_0.i[3] = -(uint)(auVar161._12_4_ <= fVar149) & valid.field_0.i[3];
              }
              iVar37 = movmskps((int)pRVar40,(undefined1  [16])valid.field_0);
              if (iVar37 == 0) goto LAB_00292e41;
              auVar61 = blendvps(_DAT_01feb9f0,auVar161,(undefined1  [16])valid.field_0);
              auVar126._4_4_ = auVar61._0_4_;
              auVar126._0_4_ = auVar61._4_4_;
              auVar126._8_4_ = auVar61._12_4_;
              auVar126._12_4_ = auVar61._8_4_;
              auVar93 = minps(auVar126,auVar61);
              auVar98._0_8_ = auVar93._8_8_;
              auVar98._8_4_ = auVar93._0_4_;
              auVar98._12_4_ = auVar93._4_4_;
              auVar93 = minps(auVar98,auVar93);
              auVar99._0_8_ =
                   CONCAT44(-(uint)(auVar93._4_4_ == auVar61._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar93._0_4_ == auVar61._0_4_) & valid.field_0._0_4_);
              auVar99._8_4_ = -(uint)(auVar93._8_4_ == auVar61._8_4_) & valid.field_0._8_4_;
              auVar99._12_4_ = -(uint)(auVar93._12_4_ == auVar61._12_4_) & valid.field_0._12_4_;
              iVar37 = movmskps(iVar37,auVar99);
              aVar81 = valid.field_0;
              if (iVar37 != 0) {
                aVar81.i[2] = auVar99._8_4_;
                aVar81._0_8_ = auVar99._0_8_;
                aVar81.i[3] = auVar99._12_4_;
              }
              uVar42 = movmskps(iVar37,(undefined1  [16])aVar81);
              uVar49 = CONCAT44((int)((ulong)pRVar40 >> 0x20),uVar42);
              lVar39 = 0;
              if (uVar49 != 0) {
                for (; (uVar49 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                }
              }
              goto LAB_002929a4;
            }
          }
        }
LAB_00292e41:
        local_1130 = local_1130 + 1;
        fStack_13cc = fStack_13d0;
      } while (local_1130 != uVar46 - 8);
    }
    uVar42 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar61._4_4_ = uVar42;
    auVar61._0_4_ = uVar42;
    auVar61._8_4_ = uVar42;
    auVar61._12_4_ = uVar42;
    uVar46 = local_1158;
    auVar93 = local_1128;
    fVar149 = local_1008;
    fVar103 = fStack_1004;
    fVar84 = fStack_1000;
    fVar185 = fStack_ffc;
    fVar134 = local_1018;
    fVar179 = fStack_1014;
    fVar113 = fStack_1010;
    fVar114 = fStack_100c;
    fVar184 = local_1058;
    fVar128 = fStack_1054;
    fVar129 = fStack_1050;
    fVar131 = fStack_104c;
    fVar133 = local_1078;
    fVar51 = fStack_1074;
    fVar82 = fStack_1070;
    fVar83 = fStack_106c;
    fVar85 = local_1118;
    fVar100 = fStack_1114;
    fVar102 = fStack_1110;
    fVar104 = fStack_110c;
    fVar111 = local_1028;
    fVar112 = fStack_1024;
    fVar127 = fStack_1020;
    fVar130 = fStack_101c;
    fVar132 = local_1038;
    fVar140 = fStack_1034;
    fVar147 = fStack_1030;
    fVar148 = fStack_102c;
    fVar150 = local_1048;
    fVar156 = fStack_1044;
    fVar157 = fStack_1040;
    fVar158 = fStack_103c;
    fVar159 = local_1068;
    fVar162 = fStack_1064;
    fVar163 = fStack_1060;
    fVar164 = fStack_105c;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }